

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O0

int __thiscall mkvparser::MkvReader::Open(MkvReader *this,char *fileName)

{
  bool bVar1;
  FILE *pFVar2;
  char *fileName_local;
  MkvReader *this_local;
  
  if (fileName == (char *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else if (this->m_file == (FILE *)0x0) {
    pFVar2 = fopen(fileName,"rb");
    this->m_file = (FILE *)pFVar2;
    if (this->m_file == (FILE *)0x0) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      bVar1 = GetFileSize(this);
      this_local._4_4_ = (uint)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int MkvReader::Open(const char* fileName) {
  if (fileName == NULL)
    return -1;

  if (m_file)
    return -1;

#ifdef _MSC_VER
  const errno_t e = fopen_s(&m_file, fileName, "rb");

  if (e)
    return -1;  // error
#else
  m_file = fopen(fileName, "rb");

  if (m_file == NULL)
    return -1;
#endif
  return !GetFileSize();
}